

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCubeCase::generateIterations
          (TextureGatherCubeCase *this)

{
  TextureFormat *textureFormat;
  int *piVar1;
  GatherType gatherType;
  ChannelOrder CVar2;
  pointer pIVar3;
  CubeFace CVar4;
  CubeFace CVar5;
  CubeFace CVar6;
  CubeFace CVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint uVar14;
  CubeFace *pCVar15;
  uint uVar16;
  ulong uVar17;
  int cubeFaceI;
  CubeFace CVar18;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  basicIterations;
  undefined1 local_78 [56];
  size_type local_40;
  undefined8 local_38;
  
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  textureFormat = &(this->super_TextureGatherCase).m_textureFormat;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)local_78);
  generateBasic2DCaseIterations
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
              *)(local_78 + 0x30),gatherType,textureFormat,(IVec2 *)local_78);
  uVar13 = local_78._48_8_;
  uVar14 = (int)((long)(local_40 - local_78._48_8_) >> 2) * 0x38e38e39;
  CVar18 = CUBEFACE_NEGATIVE_X;
  do {
    if (CVar18 == CUBEFACE_NEGATIVE_X) {
      pCVar15 = (CubeFace *)uVar13;
      uVar17 = (ulong)(uVar14 & 0x7fffffff);
      if (0 < (int)uVar14) {
        do {
          local_78._36_4_ = 0;
          local_78._0_4_ = 0xffffffff;
          local_78._20_4_ = 0;
          local_78._24_4_ = 0;
          local_78._28_4_ = 0;
          local_78._32_4_ = 0;
          local_78._4_4_ = 0;
          local_78._8_4_ = 0;
          local_78._12_4_ = 0;
          local_78._16_4_ = 0;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
          ::push_back(&this->m_iterations,(value_type *)local_78);
          pIVar3 = (this->m_iterations).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pIVar3[-1].gatherArgs.offsets[3].m_data[1] = pCVar15[8];
          CVar4 = *pCVar15;
          CVar5 = pCVar15[1];
          CVar6 = pCVar15[2];
          CVar7 = pCVar15[3];
          uVar12 = *(undefined8 *)(pCVar15 + 6);
          *(undefined8 *)(pIVar3[-1].gatherArgs.offsets[1].m_data + 1) =
               *(undefined8 *)(pCVar15 + 4);
          *(undefined8 *)(pIVar3[-1].gatherArgs.offsets[2].m_data + 1) = uVar12;
          pIVar3[-1].gatherArgs.componentNdx = CVar4;
          pIVar3[-1].gatherArgs.offsets[0].m_data[0] = CVar5;
          pIVar3[-1].gatherArgs.offsets[0].m_data[1] = CVar6;
          pIVar3[-1].gatherArgs.offsets[1].m_data[0] = CVar7;
          (this->m_iterations).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].face = CUBEFACE_NEGATIVE_X;
          uVar17 = uVar17 - 1;
          pCVar15 = pCVar15 + 9;
        } while (uVar17 != 0);
      }
    }
    else if (0 < (int)uVar14) {
      CVar2 = textureFormat->order;
      uVar17 = 0;
      pCVar15 = (CubeFace *)uVar13;
      do {
        if ((CVar2 == D) || (CVar2 == DS)) {
          uVar17 = 0;
LAB_006067c2:
          local_78._36_4_ = 0;
          local_78._0_4_ = 0xffffffff;
          local_78._20_4_ = 0;
          local_78._24_4_ = 0;
          local_78._28_4_ = 0;
          local_78._32_4_ = 0;
          local_78._4_4_ = 0;
          local_78._8_4_ = 0;
          local_78._12_4_ = 0;
          local_78._16_4_ = 0;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
          ::push_back(&this->m_iterations,(value_type *)local_78);
          pIVar3 = (this->m_iterations).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pIVar3[-1].gatherArgs.offsets[3].m_data[1] = *(int *)(uVar13 + uVar17 * 0x24 + 0x20);
          piVar1 = (int *)(uVar13 + uVar17 * 0x24);
          iVar8 = *piVar1;
          iVar9 = piVar1[1];
          iVar10 = piVar1[2];
          iVar11 = piVar1[3];
          uVar12 = *(undefined8 *)((pointer)(uVar13 + uVar17 * 0x24 + 0x10) + 8);
          *(undefined8 *)(pIVar3[-1].gatherArgs.offsets[1].m_data + 1) =
               *(undefined8 *)(uVar13 + uVar17 * 0x24 + 0x10);
          *(undefined8 *)(pIVar3[-1].gatherArgs.offsets[2].m_data + 1) = uVar12;
          pIVar3[-1].gatherArgs.componentNdx = iVar8;
          pIVar3[-1].gatherArgs.offsets[0].m_data[0] = iVar9;
          pIVar3[-1].gatherArgs.offsets[0].m_data[1] = iVar10;
          pIVar3[-1].gatherArgs.offsets[1].m_data[0] = iVar11;
          (this->m_iterations).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].face = CVar18;
          break;
        }
        if (*pCVar15 == (CVar18 & CUBEFACE_POSITIVE_Y)) goto LAB_006067c2;
        uVar16 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar16;
        pCVar15 = pCVar15 + 9;
      } while (uVar14 != uVar16);
    }
    CVar18 = CVar18 + CUBEFACE_POSITIVE_X;
    if (CVar18 == CUBEFACE_LAST) {
      if ((CubeFace *)local_78._48_8_ == (CubeFace *)0x0) {
        return;
      }
      operator_delete((void *)local_78._48_8_,local_38 - local_78._48_8_);
      return;
    }
  } while( true );
}

Assistant:

void TextureGatherCubeCase::generateIterations (void)
{
	DE_ASSERT(m_iterations.empty());

	const vector<GatherArgs> basicIterations = generateBasic2DCaseIterations(m_gatherType, m_textureFormat, getOffsetRange());

	for (int cubeFaceI = 0; cubeFaceI < tcu::CUBEFACE_LAST; cubeFaceI++)
	{
		const tcu::CubeFace cubeFace = (tcu::CubeFace)cubeFaceI;

		// Don't duplicate all cases for all faces.
		if (cubeFaceI == 0)
		{
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				m_iterations.push_back(Iteration());
				m_iterations.back().gatherArgs = basicIterations[basicNdx];
				m_iterations.back().face = cubeFace;
			}
		}
		else
		{
			// For other faces than first, only test one component per face.
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				if (isDepthFormat(m_textureFormat) || basicIterations[basicNdx].componentNdx == cubeFaceI % 4)
				{
					m_iterations.push_back(Iteration());
					m_iterations.back().gatherArgs = basicIterations[basicNdx];
					m_iterations.back().face = cubeFace;
					break;
				}
			}
		}
	}
}